

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O3

int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,void *memo,ogg_int32_t *out)

{
  if (memo == (void *)0x0) {
    memset(out,0,*i << 2);
  }
  else {
    vorbis_lsp_to_curve(out,*(int **)((long)i + 0x10),*i,(int)out,(ogg_int32_t *)memo,
                        *(int *)((long)i + 0xc),
                        *(ogg_int32_t *)((long)memo + (long)*(int *)((long)i + 0xc) * 4),
                        *(ogg_int32_t *)(*(long *)((long)i + 0x18) + 0x1c),
                        *(ogg_int32_t **)((long)i + 0x20));
  }
  return (uint)(memo != (void *)0x0);
}

Assistant:

static int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,
			   void *memo,ogg_int32_t *out){
(void)vb;
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  vorbis_info_floor0 *info=look->vi;
  
  if(memo){
    ogg_int32_t *lsp=(ogg_int32_t *)memo;
    ogg_int32_t amp=lsp[look->m];

    /* take the coefficients back to a spectral envelope curve */
    vorbis_lsp_to_curve(out,look->linearmap,look->n,look->ln,
			lsp,look->m,amp,info->ampdB,look->lsp_look);
    return(1);
  }
  memset(out,0,sizeof(*out)*look->n);
  return(0);
}